

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O0

void __thiscall
re2c::DFA::count_used_labels
          (DFA *this,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used,
          label_t start,label_t initial,bool force_start)

{
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *psVar1;
  opt_t *poVar2;
  size_t sVar3;
  State **ppSVar4;
  size_type sVar5;
  uint local_54;
  State *pSStack_50;
  uint32_t i;
  State *s;
  value_type local_28;
  byte local_21;
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *psStack_20;
  bool force_start_local;
  set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used_local;
  DFA *this_local;
  label_t initial_local;
  label_t start_local;
  
  local_21 = force_start;
  psStack_20 = used;
  used_local = (set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)this;
  this_local._0_4_ = initial.value;
  this_local._4_4_ = start.value;
  poVar2 = Opt::operator->((Opt *)&opts);
  psVar1 = psStack_20;
  if ((poVar2->fFlag & 1U) != 0) {
    local_28.value = (uint32_t)label_t::first();
    std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::insert
              (psVar1,&local_28);
  }
  if ((local_21 & 1) != 0) {
    std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::insert
              (psStack_20,(value_type *)((long)&this_local + 4));
  }
  for (pSStack_50 = this->head; pSStack_50 != (State *)0x0; pSStack_50 = pSStack_50->next) {
    Go::used_labels(&pSStack_50->go,psStack_20);
  }
  local_54 = 0;
  while( true ) {
    sVar3 = uniq_vector_t<const_re2c::State_*>::size(&this->accepts);
    psVar1 = psStack_20;
    if (sVar3 <= local_54) break;
    ppSVar4 = uniq_vector_t<const_re2c::State_*>::operator[](&this->accepts,(ulong)local_54);
    std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::insert
              (psVar1,&(*ppSVar4)->label);
    local_54 = local_54 + 1;
  }
  sVar5 = std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::count
                    (psStack_20,&this->head->label);
  if (sVar5 != 0) {
    std::set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>::insert
              (psStack_20,(value_type *)&this_local);
  }
  return;
}

Assistant:

void DFA::count_used_labels (std::set<label_t> & used, label_t start, label_t initial, bool force_start) const
{
	// In '-f' mode, default state is always state 0
	if (opts->fFlag)
	{
		used.insert (label_t::first ());
	}
	if (force_start)
	{
		used.insert (start);
	}
	for (State * s = head; s; s = s->next)
	{
		s->go.used_labels (used);
	}
	for (uint32_t i = 0; i < accepts.size (); ++i)
	{
		used.insert (accepts[i]->label);
	}
	// must go last: it needs the set of used labels
	if (used.count (head->label))
	{
		used.insert (initial);
	}
}